

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_randomness(int N,void *pBuf)

{
  long lVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  sqlite3_vfs *psVar4;
  long lVar5;
  uint uVar6;
  u32 uVar7;
  u32 uVar8;
  u32 uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  u32 uVar16;
  uint uVar17;
  u32 uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  u32 uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long in_FS_OFFSET;
  u32 local_9c;
  u32 local_98;
  int local_94;
  u32 local_78;
  uint uStack_74;
  u32 uStack_70;
  uint uStack_6c;
  u32 local_68;
  uint uStack_64;
  u32 uStack_60;
  uint uStack_5c;
  u32 local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    if (sqlite3Config.bCoreMutex == '\0') {
      psVar3 = (sqlite3_mutex *)0x0;
    }
    else {
      psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(5);
    }
    if (psVar3 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(psVar3);
    }
    if (N < 1 || pBuf == (void *)0x0) {
      sqlite3Prng.s._0_8_ = sqlite3Prng.s._0_8_ & 0xffffffff00000000;
    }
    else {
      if (sqlite3Prng.s[0] == 0) {
        psVar4 = sqlite3_vfs_find((char *)0x0);
        sqlite3Prng.s[0] = 0x61707865;
        sqlite3Prng.s[1] = 0x3320646e;
        sqlite3Prng.s[2] = 0x79622d32;
        sqlite3Prng.s[3] = 0x6b206574;
        if (psVar4 == (sqlite3_vfs *)0x0) {
          sqlite3Prng.s[0xc] = 0;
          sqlite3Prng.s[0xd] = 0;
          sqlite3Prng.s[0xe] = 0;
          sqlite3Prng.s[8] = 0;
          sqlite3Prng.s[9] = 0;
          sqlite3Prng.s[10] = 0;
          sqlite3Prng.s[0xb] = 0;
          sqlite3Prng.s[4] = 0;
          sqlite3Prng.s[5] = 0;
          sqlite3Prng.s[6] = 0;
          sqlite3Prng.s[7] = 0;
        }
        else if (sqlite3Config.iPrngSeed == 0) {
          (*psVar4->xRandomness)(psVar4,0x2c,(char *)(sqlite3Prng.s + 4));
        }
        else {
          sqlite3Prng.s[0xc] = 0;
          sqlite3Prng.s[0xd] = 0;
          sqlite3Prng.s[0xe] = 0;
          sqlite3Prng.s[8] = 0;
          sqlite3Prng.s[9] = 0;
          sqlite3Prng.s[10] = 0;
          sqlite3Prng.s[0xb] = 0;
          sqlite3Prng.s._20_12_ = SUB1612((undefined1  [16])0x0,4);
          sqlite3Prng.s[4] = sqlite3Config.iPrngSeed;
        }
        sqlite3Prng.s[0xf] = sqlite3Prng.s[0xc];
        sqlite3Prng.s[0xc] = 0;
        sqlite3Prng.n = '\0';
      }
      uVar19 = (uint)sqlite3Prng.n;
      local_94 = N;
      if ((int)(uint)sqlite3Prng.n < N) {
        do {
          if (sqlite3Prng.n != '\0') {
            memcpy(pBuf,sqlite3Prng.out,(ulong)sqlite3Prng.n);
            local_94 = local_94 - (uint)sqlite3Prng.n;
            pBuf = (void *)((long)pBuf + (ulong)(uint)sqlite3Prng.n);
          }
          sqlite3Prng.s[0xc] = sqlite3Prng.s[0xc] + 1;
          local_68 = sqlite3Prng.s[4];
          uStack_64 = sqlite3Prng.s[5];
          local_78 = sqlite3Prng.s[0];
          uStack_74 = sqlite3Prng.s[1];
          local_98 = uStack_74;
          local_58 = sqlite3Prng.s[8];
          uStack_54 = sqlite3Prng.s[9];
          local_9c = uStack_54;
          uStack_60 = sqlite3Prng.s[6];
          uStack_70 = sqlite3Prng.s[2];
          uStack_5c = sqlite3Prng.s[7];
          uStack_6c = sqlite3Prng.s[3];
          iVar2 = 10;
          uVar22 = sqlite3Prng.s[0xc];
          uVar7 = sqlite3Prng.s[0xd];
          uVar16 = sqlite3Prng.s[0xe];
          uVar18 = sqlite3Prng.s[10];
          uVar8 = sqlite3Prng.s[0xf];
          uVar9 = sqlite3Prng.s[0xb];
          do {
            uVar19 = uVar22 ^ local_78 + local_68;
            uVar20 = uVar19 << 0x10 | uVar19 >> 0x10;
            uVar6 = local_58 + uVar20;
            uVar19 = local_68 ^ uVar6;
            uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
            uVar24 = local_78 + local_68 + uVar19;
            uVar20 = uVar20 ^ uVar24;
            uVar21 = uVar20 << 8 | uVar20 >> 0x18;
            uVar6 = uVar6 + uVar21;
            uVar19 = uVar19 ^ uVar6;
            uVar10 = uVar19 << 7 | uVar19 >> 0x19;
            uVar19 = uVar7 ^ local_98 + uStack_64;
            uVar20 = uVar19 << 0x10 | uVar19 >> 0x10;
            local_9c = local_9c + uVar20;
            uVar19 = uStack_64 ^ local_9c;
            uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
            local_98 = local_98 + uStack_64 + uVar19;
            uVar20 = uVar20 ^ local_98;
            uVar20 = uVar20 << 8 | uVar20 >> 0x18;
            local_9c = local_9c + uVar20;
            uVar19 = uVar19 ^ local_9c;
            uVar19 = uVar19 << 7 | uVar19 >> 0x19;
            uVar13 = uVar16 ^ uStack_70 + uStack_60;
            uVar14 = uVar13 << 0x10 | uVar13 >> 0x10;
            uVar17 = uVar18 + uVar14;
            uVar13 = uStack_60 ^ uVar17;
            uVar13 = uVar13 << 0xc | uVar13 >> 0x14;
            uVar12 = uStack_70 + uStack_60 + uVar13;
            uVar14 = uVar14 ^ uVar12;
            uVar15 = uVar14 << 8 | uVar14 >> 0x18;
            uVar17 = uVar17 + uVar15;
            uVar13 = uVar13 ^ uVar17;
            uVar11 = uVar13 << 7 | uVar13 >> 0x19;
            uVar13 = uVar8 ^ uStack_6c + uStack_5c;
            uVar13 = uVar13 << 0x10 | uVar13 >> 0x10;
            uVar14 = uVar9 + uVar13;
            uVar23 = uStack_5c ^ uVar14;
            uVar23 = uVar23 << 0xc | uVar23 >> 0x14;
            uVar25 = uStack_6c + uStack_5c + uVar23;
            uVar13 = uVar13 ^ uVar25;
            uVar13 = uVar13 << 8 | uVar13 >> 0x18;
            uVar14 = uVar14 + uVar13;
            uVar23 = uVar23 ^ uVar14;
            uVar23 = uVar23 << 7 | uVar23 >> 0x19;
            uVar24 = uVar24 + uVar19;
            uVar13 = uVar13 ^ uVar24;
            uVar13 = uVar13 << 0x10 | uVar13 >> 0x10;
            uVar17 = uVar17 + uVar13;
            uVar19 = uVar19 ^ uVar17;
            uVar19 = uVar19 << 0xc | uVar19 >> 0x14;
            local_78 = uVar24 + uVar19;
            uVar13 = uVar13 ^ local_78;
            uVar8 = uVar13 << 8 | uVar13 >> 0x18;
            uVar18 = uVar17 + uVar8;
            uVar19 = uVar19 ^ uVar18;
            uStack_64 = uVar19 << 7 | uVar19 >> 0x19;
            local_98 = local_98 + uVar11;
            uVar21 = uVar21 ^ local_98;
            uVar13 = uVar21 << 0x10 | uVar21 >> 0x10;
            uVar14 = uVar14 + uVar13;
            uVar11 = uVar11 ^ uVar14;
            uVar19 = uVar11 << 0xc | uVar11 >> 0x14;
            local_98 = local_98 + uVar19;
            uVar13 = uVar13 ^ local_98;
            uVar22 = uVar13 << 8 | uVar13 >> 0x18;
            uVar9 = uVar14 + uVar22;
            uVar19 = uVar19 ^ uVar9;
            uStack_60 = uVar19 << 7 | uVar19 >> 0x19;
            uVar12 = uVar12 + uVar23;
            uVar20 = uVar20 ^ uVar12;
            uVar19 = uVar20 << 0x10 | uVar20 >> 0x10;
            uVar6 = uVar6 + uVar19;
            uVar23 = uVar23 ^ uVar6;
            uVar20 = uVar23 << 0xc | uVar23 >> 0x14;
            uStack_70 = uVar12 + uVar20;
            uVar19 = uVar19 ^ uStack_70;
            uVar7 = uVar19 << 8 | uVar19 >> 0x18;
            local_58 = uVar6 + uVar7;
            uVar20 = uVar20 ^ local_58;
            uStack_5c = uVar20 << 7 | uVar20 >> 0x19;
            uVar25 = uVar25 + uVar10;
            uVar15 = uVar15 ^ uVar25;
            uVar6 = uVar15 << 0x10 | uVar15 >> 0x10;
            local_9c = local_9c + uVar6;
            uVar10 = uVar10 ^ local_9c;
            uVar19 = uVar10 << 0xc | uVar10 >> 0x14;
            uStack_6c = uVar25 + uVar19;
            uVar6 = uVar6 ^ uStack_6c;
            uVar16 = uVar6 << 8 | uVar6 >> 0x18;
            local_9c = local_9c + uVar16;
            uVar19 = uVar19 ^ local_9c;
            local_68 = uVar19 << 7 | uVar19 >> 0x19;
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
          _local_78 = CONCAT44(local_98,local_78);
          _local_48 = CONCAT44(uVar7,uVar22);
          _local_58 = CONCAT44(local_9c,local_58);
          _uStack_40 = CONCAT44(uVar8,uVar16);
          _uStack_50 = CONCAT44(uVar9,uVar18);
          lVar5 = 0;
          do {
            uVar22 = sqlite3Prng.s[lVar5 + 1];
            uVar7 = sqlite3Prng.s[lVar5 + 2];
            uVar16 = sqlite3Prng.s[lVar5 + 3];
            uVar19 = (&uStack_74)[lVar5];
            uVar18 = (&uStack_70)[lVar5];
            uVar6 = (&uStack_6c)[lVar5];
            lVar1 = lVar5 * 4;
            *(u32 *)(sqlite3Prng.out + lVar1) = sqlite3Prng.s[lVar5] + (&local_78)[lVar5];
            *(u32 *)(sqlite3Prng.out + lVar1 + 4) = uVar22 + uVar19;
            *(u32 *)(sqlite3Prng.out + lVar1 + 8) = uVar7 + uVar18;
            *(u32 *)(sqlite3Prng.out + lVar1 + 0xc) = uVar16 + uVar6;
            lVar5 = lVar5 + 4;
          } while (lVar5 != 0x10);
          sqlite3Prng.n = '@';
        } while (0x40 < local_94);
        uVar19 = 0x40;
        N = local_94;
      }
      memcpy(pBuf,sqlite3Prng.out + (int)(uVar19 - N),(long)N);
      sqlite3Prng.n = sqlite3Prng.n - (char)N;
    }
    if (psVar3 != (sqlite3_mutex *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar3);
        return;
      }
      goto LAB_00120488;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00120488:
  __stack_chk_fail();
}

Assistant:

SQLITE_API void sqlite3_randomness(int N, void *pBuf){
  unsigned char *zBuf = pBuf;

  /* The "wsdPrng" macro will resolve to the pseudo-random number generator
  ** state vector.  If writable static data is unsupported on the target,
  ** we have to locate the state vector at run-time.  In the more common
  ** case where writable static data is supported, wsdPrng can refer directly
  ** to the "sqlite3Prng" state vector declared above.
  */
#ifdef SQLITE_OMIT_WSD
  struct sqlite3PrngType *p = &GLOBAL(struct sqlite3PrngType, sqlite3Prng);
# define wsdPrng p[0]
#else
# define wsdPrng sqlite3Prng
#endif

#if SQLITE_THREADSAFE
  sqlite3_mutex *mutex;
#endif

#ifndef SQLITE_OMIT_AUTOINIT
  if( sqlite3_initialize() ) return;
#endif

#if SQLITE_THREADSAFE
  mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_PRNG);
#endif

  sqlite3_mutex_enter(mutex);
  if( N<=0 || pBuf==0 ){
    wsdPrng.s[0] = 0;
    sqlite3_mutex_leave(mutex);
    return;
  }

  /* Initialize the state of the random number generator once,
  ** the first time this routine is called.
  */
  if( wsdPrng.s[0]==0 ){
    sqlite3_vfs *pVfs = sqlite3_vfs_find(0);
    static const u32 chacha20_init[] = {
      0x61707865, 0x3320646e, 0x79622d32, 0x6b206574
    };
    memcpy(&wsdPrng.s[0], chacha20_init, 16);
    if( NEVER(pVfs==0) ){
      memset(&wsdPrng.s[4], 0, 44);
    }else{
      sqlite3OsRandomness(pVfs, 44, (char*)&wsdPrng.s[4]);
    }
    wsdPrng.s[15] = wsdPrng.s[12];
    wsdPrng.s[12] = 0;
    wsdPrng.n = 0;
  }

  assert( N>0 );
  while( 1 /* exit by break */ ){
    if( N<=wsdPrng.n ){
      memcpy(zBuf, &wsdPrng.out[wsdPrng.n-N], N);
      wsdPrng.n -= N;
      break;
    }
    if( wsdPrng.n>0 ){
      memcpy(zBuf, wsdPrng.out, wsdPrng.n);
      N -= wsdPrng.n;
      zBuf += wsdPrng.n;
    }
    wsdPrng.s[12]++;
    chacha_block((u32*)wsdPrng.out, wsdPrng.s);
    wsdPrng.n = 64;
  }
  sqlite3_mutex_leave(mutex);
}